

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

bool __thiscall Am_Object::Is_Part_Of(Am_Object *this,Am_Object *in_owner)

{
  Am_Object_Data *pAVar1;
  bool bVar2;
  
  pAVar1 = this->data;
  if (pAVar1 == (Am_Object_Data *)0x0) {
    return false;
  }
  do {
    bVar2 = pAVar1 == in_owner->data;
    if (bVar2) {
      return bVar2;
    }
    pAVar1 = (Am_Object_Data *)(pAVar1->owner_slot).super_Am_Value.value.proc_value;
  } while (pAVar1 != (Am_Object_Data *)0x0);
  return bVar2;
}

Assistant:

bool
Am_Object::Is_Part_Of(Am_Object in_owner) const
{
  Am_Object_Data *current = data;
  while (current) {
    if (current == in_owner.data)
      return true;
    current = (Am_Object_Data *)current->owner_slot.value.wrapper_value;
  }
  return false;
}